

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMffc.c
# Opt level: O0

int Aig_NodeMffcLabelCut(Aig_Man_t *p,Aig_Obj_t *pNode,Vec_Ptr_t *vLeaves)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  int ConeSize2;
  int ConeSize1;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vLeaves_local;
  Aig_Obj_t *pNode_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_IsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigMffc.c"
                  ,0xf0,"int Aig_NodeMffcLabelCut(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  iVar1 = Aig_ObjIsNode(pNode);
  if (iVar1 == 0) {
    __assert_fail("Aig_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigMffc.c"
                  ,0xf1,"int Aig_NodeMffcLabelCut(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  Aig_ManIncrementTravId(p);
  for (ConeSize2 = 0; iVar1 = Vec_PtrSize(vLeaves), ConeSize2 < iVar1; ConeSize2 = ConeSize2 + 1) {
    pvVar4 = Vec_PtrEntry(vLeaves,ConeSize2);
    *(ulong *)((long)pvVar4 + 0x18) =
         *(ulong *)((long)pvVar4 + 0x18) & 0xffffffff0000003f |
         ((ulong)(((uint)(*(ulong *)((long)pvVar4 + 0x18) >> 6) & 0x3ffffff) + 1) & 0x3ffffff) << 6;
  }
  iVar1 = Aig_NodeDeref_rec(pNode,0,(float *)0x0,(float *)0x0);
  iVar2 = Aig_NodeRefLabel_rec(p,pNode,0);
  for (ConeSize2 = 0; iVar3 = Vec_PtrSize(vLeaves), ConeSize2 < iVar3; ConeSize2 = ConeSize2 + 1) {
    pvVar4 = Vec_PtrEntry(vLeaves,ConeSize2);
    *(ulong *)((long)pvVar4 + 0x18) =
         *(ulong *)((long)pvVar4 + 0x18) & 0xffffffff0000003f |
         ((ulong)(((uint)(*(ulong *)((long)pvVar4 + 0x18) >> 6) & 0x3ffffff) - 1) & 0x3ffffff) << 6;
  }
  if (iVar1 != iVar2) {
    __assert_fail("ConeSize1 == ConeSize2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigMffc.c"
                  ,0xf9,"int Aig_NodeMffcLabelCut(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  if (iVar1 < 1) {
    __assert_fail("ConeSize1 > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigMffc.c"
                  ,0xfa,"int Aig_NodeMffcLabelCut(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  return iVar1;
}

Assistant:

int Aig_NodeMffcLabelCut( Aig_Man_t * p, Aig_Obj_t * pNode, Vec_Ptr_t * vLeaves )
{
    Aig_Obj_t * pObj;
    int i, ConeSize1, ConeSize2;
    assert( !Aig_IsComplement(pNode) );
    assert( Aig_ObjIsNode(pNode) );
    Aig_ManIncrementTravId( p );
    Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pObj, i )
        pObj->nRefs++;
    ConeSize1 = Aig_NodeDeref_rec( pNode, 0, NULL, NULL );
    ConeSize2 = Aig_NodeRefLabel_rec( p, pNode, 0 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pObj, i )
        pObj->nRefs--;
    assert( ConeSize1 == ConeSize2 );
    assert( ConeSize1 > 0 );
    return ConeSize1;
}